

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tsgDreamSample.hpp
# Opt level: O3

DreamPDF *
TasDREAM::posterior<(TasDREAM::TypeSamplingForm)1>
          (DreamPDF *__return_storage_ptr__,DreamMergedLikelyModel *likelihood_model,
          DreamPrior *prior)

{
  _Any_data _Stack_58;
  code *local_48;
  _Any_data local_38;
  code *local_28;
  
  std::
  function<void_(const_std::vector<double,_std::allocator<double>_>_&,_std::vector<double,_std::allocator<double>_>_&)>
  ::function((function<void_(const_std::vector<double,_std::allocator<double>_>_&,_std::vector<double,_std::allocator<double>_>_&)>
              *)&_Stack_58,likelihood_model);
  std::
  function<void_(TasDREAM::TypeSamplingForm,_const_std::vector<double,_std::allocator<double>_>_&,_std::vector<double,_std::allocator<double>_>_&)>
  ::function((function<void_(TasDREAM::TypeSamplingForm,_const_std::vector<double,_std::allocator<double>_>_&,_std::vector<double,_std::allocator<double>_>_&)>
              *)&local_38,prior);
  std::
  function<void(std::vector<double,std::allocator<double>>const&,std::vector<double,std::allocator<double>>&)>
  ::
  function<TasDREAM::posterior<(TasDREAM::TypeSamplingForm)1>(std::function<void(std::vector<double,std::allocator<double>>const&,std::vector<double,std::allocator<double>>&)>,std::function<void(TasDREAM::TypeSamplingForm,std::vector<double,std::allocator<double>>const&,std::vector<double,std::allocator<double>>&)>)::_lambda(std::vector<double,std::allocator<double>>const&,std::vector<double,std::allocator<double>>&)_1_,void>
            ((function<void(std::vector<double,std::allocator<double>>const&,std::vector<double,std::allocator<double>>&)>
              *)__return_storage_ptr__,(anon_class_64_2_a55f5f71 *)&_Stack_58);
  if (local_28 != (code *)0x0) {
    (*local_28)(&local_38,&local_38,__destroy_functor);
  }
  if (local_48 != (code *)0x0) {
    (*local_48)(&_Stack_58,&_Stack_58,__destroy_functor);
  }
  return __return_storage_ptr__;
}

Assistant:

DreamPDF posterior(DreamMergedLikelyModel likelihood_model,
          DreamPrior prior){
    return [=](const std::vector<double> &candidates, std::vector<double> &values)->void{
        likelihood_model(candidates, values);

        std::vector<double> prior_vals(values.size());
        prior(form, candidates, prior_vals);

        auto iv = values.begin();
        if (form == regform){
            for(auto p : prior_vals) *iv++ *= p;
        }else{
            for(auto p : prior_vals) *iv++ += p;
        }
    };
}